

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O3

void __thiscall PathTracerThread::SetPause(PathTracerThread *this,bool pause)

{
  mutex *__mutex;
  double dVar1;
  int iVar2;
  logger *this_00;
  
  if ((bool)((this->m_pause)._M_base._M_i & 1U) == pause) {
    return;
  }
  dVar1 = glfwGetTime();
  this->m_time = dVar1 - this->m_time;
  (this->m_pause)._M_base._M_i = pause;
  this_00 = spdlog::default_logger_raw();
  spdlog::logger::log(this_00,0.0);
  __mutex = &(this->m_pause_semaphore).m_mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if ((this->m_pause_semaphore).m_state == false) {
      (this->m_pause_semaphore).m_state = true;
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void PathTracerThread::SetPause(bool pause) {
	if (pause == m_pause)
		return;
	m_time = glfwGetTime() - m_time;
	m_pause.store(pause, std::memory_order_release);

	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();
}